

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

void __thiscall
apngasm::APNGAsm::compose_frame
          (APNGAsm *this,uchar **rows_dst,uchar **rows_src,uchar bop,uint x,uint y,uint w,uint h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte *local_50;
  uchar *dp;
  uchar *sp;
  int al;
  int v;
  int u;
  uint j;
  uint i;
  uint y_local;
  uint x_local;
  uchar bop_local;
  uchar **rows_src_local;
  uchar **rows_dst_local;
  APNGAsm *this_local;
  
  for (v = 0; (uint)v < h; v = v + 1) {
    dp = rows_src[(uint)v];
    local_50 = rows_dst[v + y] + (x << 2);
    if (bop == '\0') {
      memcpy(local_50,dp,(ulong)(w << 2));
    }
    else {
      for (u = 0; (uint)u < w; u = u + 1) {
        if (dp[3] == 0xff) {
          *(undefined4 *)local_50 = *(undefined4 *)dp;
        }
        else if (dp[3] != '\0') {
          if (local_50[3] == 0) {
            *(undefined4 *)local_50 = *(undefined4 *)dp;
          }
          else {
            iVar1 = (uint)dp[3] * 0xff;
            iVar2 = (0xff - (uint)dp[3]) * (uint)local_50[3];
            iVar3 = iVar1 + iVar2;
            *local_50 = (byte)((int)((uint)*dp * iVar1 + (uint)*local_50 * iVar2) / iVar3);
            local_50[1] = (byte)((int)((uint)dp[1] * iVar1 + (uint)local_50[1] * iVar2) / iVar3);
            local_50[2] = (byte)((int)((uint)dp[2] * iVar1 + (uint)local_50[2] * iVar2) / iVar3);
            local_50[3] = (byte)((long)iVar3 / 0xff);
          }
        }
        dp = dp + 4;
        local_50 = local_50 + 4;
      }
    }
  }
  return;
}

Assistant:

void APNGAsm::compose_frame(unsigned char ** rows_dst, unsigned char ** rows_src, unsigned char bop, unsigned int x, unsigned int y, unsigned int w, unsigned int h)
  {
    unsigned int  i, j;
    int u, v, al;

    for (j=0; j<h; j++)
    {
      unsigned char * sp = rows_src[j];
      unsigned char * dp = rows_dst[j+y] + x*4;

      if (bop == 0)
        memcpy(dp, sp, w*4);
      else
      for (i=0; i<w; i++, sp+=4, dp+=4)
      {
        if (sp[3] == 255)
          memcpy(dp, sp, 4);
        else
        if (sp[3] != 0)
        {
          if (dp[3] != 0)
          {
            u = sp[3]*255;
            v = (255-sp[3])*dp[3];
            al = u + v;
            dp[0] = (sp[0]*u + dp[0]*v)/al;
            dp[1] = (sp[1]*u + dp[1]*v)/al;
            dp[2] = (sp[2]*u + dp[2]*v)/al;
            dp[3] = al/255;
          }
          else
            memcpy(dp, sp, 4);
        }
      }
    }
  }